

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O1

bool __thiscall Network::Client::RingBufferStorage::Impl::release(Impl *this,uint16 packetID)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  PacketBookmark *pPVar6;
  ulong uVar7;
  uint uVar8;
  PacketBookmark *pPVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  
  bVar1 = this->packetsCount;
  if ((ulong)bVar1 == 0) {
    uVar5 = 0;
  }
  else {
    pPVar6 = this->packets;
    uVar5 = 0;
    do {
      if (*(uint16 *)pPVar6 == packetID) goto LAB_0011e6ca;
      uVar5 = uVar5 + 1;
      pPVar6 = pPVar6 + 0xc;
    } while (bVar1 != uVar5);
    uVar5 = (ulong)bVar1;
  }
LAB_0011e6ca:
  if ((byte)uVar5 < bVar1) {
    pPVar6 = this->packets;
    uVar7 = uVar5 & 0xff;
    iVar3 = *(int *)(pPVar6 + uVar7 * 0xc + 4);
    uVar15 = *(uint *)(pPVar6 + uVar7 * 0xc + 8);
    uVar8 = this->sm1;
    *(undefined2 *)(pPVar6 + uVar7 * 0xc) = 0;
    *(undefined4 *)(pPVar6 + uVar7 * 0xc + 4) = 0;
    *(undefined4 *)(pPVar6 + uVar7 * 0xc + 8) = 0;
    if (uVar15 == this->r) {
      this->r = this->r + iVar3 & uVar8;
    }
    else {
      uVar10 = iVar3 + uVar15 & uVar8;
      uVar4 = this->w;
      if (uVar10 == uVar4) {
        this->w = uVar15;
      }
      else {
        uVar14 = ~uVar8;
        iVar11 = uVar8 + 1;
        uVar8 = 0;
        if (uVar15 <= uVar4) {
          iVar11 = 0;
        }
        if (uVar15 <= uVar10) {
          uVar14 = 0;
        }
        uVar14 = (uVar14 - uVar10) + iVar11 + uVar4;
        if (uVar14 != 0) {
          do {
            this->buffer[uVar15 + uVar8 & this->sm1] =
                 this->buffer[iVar3 + uVar15 + uVar8 & this->sm1];
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar14);
        }
        uVar8 = this->sm1;
        this->w = (iVar11 + uVar4) - iVar3 & uVar8;
        bVar2 = this->packetsCount;
        pPVar6 = this->packets;
        do {
          if (bVar2 == 0) {
            bVar12 = false;
          }
          else {
            bVar12 = false;
            pPVar9 = pPVar6 + 8;
            bVar13 = 1;
            do {
              if (*(uint *)pPVar9 == uVar10) {
                uVar10 = *(uint *)(pPVar9 + -4) + *(uint *)pPVar9 & uVar8;
                *(uint *)pPVar9 = uVar15;
                uVar15 = *(uint *)(pPVar9 + -4) + uVar15 & uVar8;
                bVar12 = true;
                break;
              }
              pPVar9 = pPVar9 + 0xc;
              bVar16 = bVar13 < bVar2;
              bVar13 = bVar13 + 1;
            } while (bVar16);
          }
        } while (bVar12);
      }
    }
  }
  return (byte)uVar5 < bVar1;
}

Assistant:

bool release(const uint16 packetID)
        {
            uint8 i = findID(packetID);
            if (i == packetsCount) return false;

            PacketBookmark & packet = packets[i];

            // Here, we have 2 cases. Either the packet is on the read position of the ring buffer
            // and in that case, we just need to advance the read position.
            // Either it's in the middle of the ring buffer and we need to move all the data around to remove it
            // Let's deal with the former case first
            uint32 pos = packet.pos, size = packet.size, end = (packet.pos + packet.size) & sm1;
            packet.set(0, 0, 0);
            if (pos == r)
            {
                r = (r + size) & sm1;
                return true;
            }

            // Another optimization step is when the write position is at the end of this packet
            // We can just revert the storage of the packet directly
            if (end == w)
            {
                w = pos;
                return true;
            }

            // Ok, now we have to move the data around here
            // First let's move memory to remove that packet.
            // We'll fix the packet's position later on
            // We are in this case here:
            //  bbbbccw  r p   eaaaaaaaaa      with p/e (pos/end) and a / b / c the next packet
            //        |  | |   |
            // [-------------------------]
            // After move, it should look like:
            //  ccw       r aaaaaaaaabbbb      with p/e (pos/end) and a / b / c the next packet
            //    |       | |   |
            // [-------------------------]
            // We see they are 3 sections: a is the data between e and the buffer end
            // b is the data whose size is equal to buffer end - p - sizeof(a) (the part that was moved from
            // the beginning of the buffer to the end of the buffer)
            // and c is the part that was move from the end of the packet to the beginning of the buffer
            // We have to perform move a to p, move b to buffer.end - a.size and move c to buffer begin

            // It's hard to think without unwrapping the buffer, so let's imagine we are doing so (we'll rewrap after discussion)
            // Let's set w' = w+sm1+1, e' = e + (sm1 - 1)
            // It'll lead to this diagram:
            //  bbbbccw  r p   eaaaaaaaaa BBBBCCW       with p/e (pos/end) and a / b / c the next packet
            //        |  | |   |                |
            // [-------------------------:-------------------------]
            // Or
            //     eaacccccw  r        p     EAACCCCCW
            //     |       |  |        |     |       |
            // [-------------------------:-------------------------]
            // Or
            //      r  p    eaaaaa w
            //      |  |    |    | |
            // [-------------------------:-------------------------]
            // In that case, we are doing a single memory move operation here, but we simply wrap the position
            uint32 s = sm1 + 1, W = w < pos ? w + s : w, E = end < pos ? end + s : end;

            for (uint32 u = 0; u < W - E; u++)
                buffer[(u + pos) & sm1] = buffer[(u + pos + size) & sm1];

            // Adjust the new write position
            w = (W - size) & sm1;

            // We can split the packets in 2 cases: before or after the packet to remove.
            // We'll iterate each packet and decide if we need to move it (it's after the packet to remove)
            // This isn't the most efficient algorithm, but since the number of packets to store is small
            // there's no point in optimizing it further

            bool continueSearching = true;
            while (continueSearching)
            {
                continueSearching = false;
                for (uint8 j = 0; j < packetsCount; j++)
                {
                    PacketBookmark & iter = packets[j];
                    if (iter.pos == end)
                    {
                        end = (iter.pos + iter.size) & sm1;
                        iter.pos = pos;
                        pos = (iter.pos + iter.size) & sm1;
                        continueSearching = true;
                        break;
                    }
                }
            }
            return true;
        }